

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

SQClosure * SQClosure::Create(SQSharedState *ss,SQFunctionProto *func,SQWeakRef *root)

{
  SQFunctionProto *func_00;
  SQClosure *pSVar1;
  SQSharedState *in_RDX;
  SQClosure *in_RSI;
  SQInteger n_1;
  SQInteger n;
  SQClosure *nc;
  SQInteger size;
  long local_38;
  long local_30;
  
  func_00 = (SQFunctionProto *)
            ((long)in_RSI[1]._defaultparams * 0x10 + 0x60 +
            in_RSI[2].super_SQCollectable.super_SQRefCounted._uiRef * 0x10);
  pSVar1 = (SQClosure *)sq_vm_malloc(0x115329);
  SQClosure(in_RSI,in_RDX,func_00);
  pSVar1->_outervalues = (SQObjectPtr *)(pSVar1 + 1);
  pSVar1->_defaultparams = pSVar1->_outervalues + (long)in_RSI[1]._defaultparams;
  pSVar1->_root = (SQWeakRef *)in_RDX;
  (pSVar1->_root->super_SQRefCounted)._uiRef = (pSVar1->_root->super_SQRefCounted)._uiRef + 1;
  for (local_30 = 0; local_30 < (long)in_RSI[1]._defaultparams; local_30 = local_30 + 1) {
    ::SQObjectPtr::SQObjectPtr(pSVar1->_outervalues + local_30);
  }
  for (local_38 = 0; local_38 < (long)in_RSI[2].super_SQCollectable.super_SQRefCounted._uiRef;
      local_38 = local_38 + 1) {
    ::SQObjectPtr::SQObjectPtr(pSVar1->_defaultparams + local_38);
  }
  return pSVar1;
}

Assistant:

static SQClosure *Create(SQSharedState *ss,SQFunctionProto *func,SQWeakRef *root){
        SQInteger size = _CALC_CLOSURE_SIZE(func);
        SQClosure *nc=(SQClosure*)SQ_MALLOC(size);
        new (nc) SQClosure(ss,func);
        nc->_outervalues = (SQObjectPtr *)(nc + 1);
        nc->_defaultparams = &nc->_outervalues[func->_noutervalues];
        nc->_root = root;
         __ObjAddRef(nc->_root);
        _CONSTRUCT_VECTOR(SQObjectPtr,func->_noutervalues,nc->_outervalues);
        _CONSTRUCT_VECTOR(SQObjectPtr,func->_ndefaultparams,nc->_defaultparams);
        return nc;
    }